

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

char * print_value(cJSON *item,int depth,int fmt)

{
  double __x;
  uint uVar1;
  bool bVar2;
  char *pcVar3;
  undefined8 *__s;
  void *__s_00;
  ulong uVar4;
  char *pcVar5;
  size_t sVar6;
  size_t sVar7;
  cJSON *pcVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  undefined8 *puVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  char *__s_01;
  undefined8 *puVar17;
  size_t sVar18;
  double dVar19;
  double dVar20;
  int local_80;
  
  if (item == (cJSON *)0x0) {
    return (char *)0x0;
  }
  uVar1 = item->type;
  if (7 < (byte)uVar1) {
    return (char *)0x0;
  }
  uVar16 = (ulong)(uint)depth;
  switch(uVar1 & 0xff) {
  case 0:
    pcVar3 = (char *)(*cJSON_malloc)(6);
    if (pcVar3 != (char *)0x0) {
      builtin_strncpy(pcVar3,"false",6);
      return pcVar3;
    }
    break;
  case 1:
    pcVar3 = (char *)(*cJSON_malloc)(5);
    if (pcVar3 != (char *)0x0) {
      builtin_strncpy(pcVar3,"true",5);
      return pcVar3;
    }
    break;
  case 2:
    pcVar3 = (char *)(*cJSON_malloc)(5);
    if (pcVar3 != (char *)0x0) {
      builtin_strncpy(pcVar3,"null",5);
      return pcVar3;
    }
    break;
  case 3:
    __x = item->valuedouble;
    if (((2.220446049250313e-16 < ABS((double)item->valueint - __x)) || (2147483647.0 < __x)) ||
       (__x < -2147483648.0)) {
      pcVar3 = (char *)(*cJSON_malloc)(0x40);
      if (pcVar3 != (char *)0x0) {
        dVar19 = floor(__x);
        dVar20 = ABS(__x);
        if ((2.220446049250313e-16 < ABS(dVar19 - __x)) || (1e+60 <= dVar20)) {
          if ((dVar20 < 1e-06) || (1000000000.0 < dVar20)) {
            pcVar5 = "%e";
          }
          else {
            pcVar5 = "%f";
          }
        }
        else {
          pcVar5 = "%.0f";
        }
        sprintf(pcVar3,pcVar5,__x);
        return pcVar3;
      }
    }
    else {
      pcVar3 = (char *)(*cJSON_malloc)(0x15);
      if (pcVar3 != (char *)0x0) {
        sprintf(pcVar3,"%d",(ulong)(uint)item->valueint);
        return pcVar3;
      }
    }
    break;
  default:
    pcVar3 = print_string_ptr(item->valuestring,(uint)(uVar1 == 4));
    return pcVar3;
  case 5:
    sVar18 = 0xfffffffffffffff8;
    uVar16 = 0;
    pcVar8 = (cJSON *)&item->child;
    do {
      pcVar8 = pcVar8->next;
      uVar16 = uVar16 - 1;
      sVar18 = sVar18 + 8;
    } while (pcVar8 != (cJSON *)0x0);
    if ((int)uVar16 == -1) {
      pcVar3 = (char *)(*cJSON_malloc)(3);
      if (pcVar3 == (char *)0x0) {
        return (char *)0x0;
      }
      pcVar3[2] = '\0';
      pcVar3[0] = '[';
      pcVar3[1] = ']';
      return pcVar3;
    }
    __s = (undefined8 *)(*cJSON_malloc)(sVar18);
    if (__s == (undefined8 *)0x0) {
      return (char *)0x0;
    }
    uVar12 = ~uVar16;
    memset(__s,0,sVar18);
    pcVar8 = item->child;
    puVar17 = __s;
    if (pcVar8 == (cJSON *)0x0) {
      sVar18 = 5;
    }
    else {
      local_80 = 3 - (uint)(fmt == 0);
      iVar15 = 5;
      puVar13 = __s;
      do {
        pcVar3 = print_value(pcVar8,depth + 1,fmt);
        *puVar13 = pcVar3;
        if (pcVar3 == (char *)0x0) goto LAB_0016d257;
        sVar6 = strlen(pcVar3);
        iVar15 = iVar15 + local_80 + (int)sVar6;
        if (pcVar3 == (char *)0x0) break;
        puVar13 = puVar13 + 1;
        pcVar8 = pcVar8->next;
      } while (pcVar8 != (cJSON *)0x0);
      sVar18 = (size_t)iVar15;
    }
    pcVar3 = (char *)(*cJSON_malloc)(sVar18);
    if (pcVar3 != (char *)0x0) {
      pcVar3[0] = '[';
      pcVar3[1] = '\0';
      pcVar5 = pcVar3 + 1;
      uVar4 = 0;
      do {
        strcpy(pcVar5,(char *)__s[uVar4]);
        __s_01 = (char *)__s[uVar4];
        sVar6 = strlen(__s_01);
        pcVar5 = pcVar5 + sVar6;
        if (-(int)uVar16 - 2 != uVar4) {
          *pcVar5 = ',';
          if (fmt == 0) {
            pcVar5 = pcVar5 + 1;
          }
          else {
            pcVar5[1] = ' ';
            pcVar5 = pcVar5 + 2;
          }
          *pcVar5 = '\0';
          __s_01 = (char *)__s[uVar4];
        }
        (*cJSON_free)(__s_01);
        uVar4 = uVar4 + 1;
      } while (uVar12 != uVar4);
      (*cJSON_free)(__s);
      pcVar5[0] = ']';
      pcVar5[1] = '\0';
      return pcVar3;
    }
LAB_0016d257:
    do {
      if ((void *)*puVar17 != (void *)0x0) {
        (*cJSON_free)((void *)*puVar17);
      }
      uVar12 = uVar12 - 1;
      puVar17 = puVar17 + 1;
    } while (uVar12 != 0);
    goto LAB_0016d2f8;
  case 6:
    sVar18 = 0xfffffffffffffff8;
    uVar12 = 0;
    pcVar8 = (cJSON *)&item->child;
    do {
      pcVar8 = pcVar8->next;
      uVar12 = uVar12 - 1;
      sVar18 = sVar18 + 8;
    } while (pcVar8 != (cJSON *)0x0);
    if ((int)uVar12 == -1) {
      iVar15 = 3;
      if (fmt != 0) {
        iVar15 = depth + 4;
      }
      pcVar3 = (char *)(*cJSON_malloc)((long)iVar15);
      if (pcVar3 == (char *)0x0) {
        return (char *)0x0;
      }
      *pcVar3 = '{';
      if (fmt == 0) {
        pcVar5 = pcVar3 + 1;
      }
      else {
        pcVar5 = pcVar3 + 2;
        pcVar3[1] = '\n';
        if (1 < depth) {
          memset(pcVar5,9,(ulong)(depth - 1));
          pcVar5 = pcVar3 + (ulong)(uint)depth + 1;
        }
      }
      pcVar5[0] = '}';
      pcVar5[1] = '\0';
      return pcVar3;
    }
    __s = (undefined8 *)(*cJSON_malloc)(sVar18);
    if (__s == (undefined8 *)0x0) {
      return (char *)0x0;
    }
    __s_00 = (*cJSON_malloc)(sVar18);
    if (__s_00 != (void *)0x0) {
      uVar4 = ~uVar12;
      memset(__s,0,sVar18);
      memset(__s_00,0,sVar18);
      iVar15 = 7;
      if (fmt != 0) {
        iVar15 = depth + 8;
      }
      pcVar8 = item->child;
      if (pcVar8 == (cJSON *)0x0) {
LAB_0016d27b:
        pcVar3 = (char *)(*cJSON_malloc)((long)iVar15);
        if (pcVar3 != (char *)0x0) {
          *pcVar3 = '{';
          if (fmt == 0) {
            pcVar5 = pcVar3 + 1;
          }
          else {
            pcVar5 = pcVar3 + 2;
            pcVar3[1] = '\n';
          }
          *pcVar5 = '\0';
          uVar14 = 0;
          do {
            if (-1 < depth && fmt != 0) {
              memset(pcVar5,9,(ulong)(depth + 1U));
              pcVar5 = pcVar5 + uVar16 + 1;
            }
            strcpy(pcVar5,*(char **)((long)__s_00 + uVar14 * 8));
            sVar6 = strlen(*(char **)((long)__s_00 + uVar14 * 8));
            pcVar5[sVar6] = ':';
            if (fmt == 0) {
              lVar11 = sVar6 + 1;
            }
            else {
              pcVar5[sVar6 + 1] = '\t';
              lVar11 = sVar6 + 2;
            }
            strcpy(pcVar5 + lVar11,(char *)__s[uVar14]);
            sVar6 = strlen((char *)__s[uVar14]);
            pcVar5 = pcVar5 + lVar11 + sVar6;
            if ((-uVar12 - 2 & 0xffffffff) != uVar14) {
              *pcVar5 = ',';
              pcVar5 = pcVar5 + 1;
            }
            if (fmt != 0) {
              *pcVar5 = '\n';
              pcVar5 = pcVar5 + 1;
            }
            *pcVar5 = '\0';
            (*cJSON_free)(*(void **)((long)__s_00 + uVar14 * 8));
            (*cJSON_free)((void *)__s[uVar14]);
            uVar14 = uVar14 + 1;
          } while (uVar4 != uVar14);
          (*cJSON_free)(__s_00);
          (*cJSON_free)(__s);
          if (0 < depth && fmt != 0) {
            memset(pcVar5,9,uVar16);
            pcVar5 = pcVar5 + uVar16;
          }
          pcVar5[0] = '}';
          pcVar5[1] = '\0';
          return pcVar3;
        }
      }
      else {
        iVar9 = 2;
        if (fmt != 0) {
          iVar9 = depth + 5;
        }
        bVar2 = true;
        lVar11 = 0;
        do {
          while( true ) {
            lVar10 = lVar11 + 1;
            pcVar3 = print_string_ptr(pcVar8->string,1);
            *(char **)((long)__s_00 + lVar10 * 8 + -8) = pcVar3;
            pcVar5 = print_value(pcVar8,depth + 1U,fmt);
            __s[lVar11] = pcVar5;
            lVar11 = lVar10;
            if ((pcVar3 == (char *)0x0) || (pcVar5 == (char *)0x0)) break;
            sVar6 = strlen(pcVar5);
            sVar7 = strlen(pcVar3);
            iVar15 = iVar15 + iVar9 + (int)sVar7 + (int)sVar6;
            pcVar8 = pcVar8->next;
            if (pcVar8 == (cJSON *)0x0) {
              if (bVar2) goto LAB_0016d27b;
              goto LAB_0016d2b7;
            }
          }
          pcVar8 = pcVar8->next;
          bVar2 = false;
        } while (pcVar8 != (cJSON *)0x0);
      }
LAB_0016d2b7:
      lVar11 = 0;
      do {
        if (*(void **)((long)__s_00 + lVar11) != (void *)0x0) {
          (*cJSON_free)(*(void **)((long)__s_00 + lVar11));
        }
        if (*(void **)((long)__s + lVar11) != (void *)0x0) {
          (*cJSON_free)(*(void **)((long)__s + lVar11));
        }
        lVar11 = lVar11 + 8;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
      (*cJSON_free)(__s_00);
    }
LAB_0016d2f8:
    (*cJSON_free)(__s);
  }
  return (char *)0x0;
}

Assistant:

static char *
print_value(cJSON *item, int depth, int fmt)
{
    char *out = 0;
    if (!item)
        return 0;
    switch ((item->type) & 255) {
        case cJSON_NULL:
            out = cJSON_strdup("null");
            break;
        case cJSON_False:
            out = cJSON_strdup("false");
            break;
        case cJSON_True:
            out = cJSON_strdup("true");
            break;
        case cJSON_Number:
            out = print_number(item);
            break;
        case cJSON_Array:
            out = print_array(item, depth, fmt);
            break;
        case cJSON_Object:
            out = print_object(item, depth, fmt);
            break;
        case cJSON_RawString:
        case cJSON_String:
            out = print_string(item);
            break;
    }
    return out;
}